

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execTasEa<(moira::Core)0,(moira::Instr)125,(moira::Mode)7,1>(Moira *this,u16 opcode)

{
  u32 addr;
  ulong in_RAX;
  uint val;
  undefined6 in_register_00000032;
  u32 data;
  u32 ea;
  
  _data = in_RAX;
  (*this->_vptr_Moira[0xc])
            (this,"execTasEa",0x7d,7,1,CONCAT62(in_register_00000032,opcode) & 0xffffffff);
  readOp<(moira::Core)0,(moira::Mode)7,1,0ull>
            (this,(uint)CONCAT62(in_register_00000032,opcode) & 7,&ea,&data);
  (this->reg).sr.n = (bool)((byte)_data >> 7);
  (this->reg).sr.z = (byte)_data == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  val = data | 0x80;
  addr = ea;
  _data = _data | 0x80;
  this->writeBuffer = (u16)val;
  write<(moira::Core)0,(moira::AddrSpace)1,1,0ull>(this,addr,val);
  prefetch<(moira::Core)0,4ull>(this);
  return;
}

Assistant:

void
Moira::execTasEa(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int dst = ( _____________xxx(opcode) );

    u32 ea, data;

    if (C == Core::C68000) {

        readOp<C, M, Byte>(dst, &ea, &data);

        reg.sr.n = NBIT<Byte>(data);
        reg.sr.z = ZERO<Byte>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
        data |= 0x80;

        if (!isRegMode(M)) SYNC(2);
        writeOp<C, M, S>(dst, ea, data);

        prefetch<C, POLL>();

    } else {

        if constexpr (M == Mode::AI) SYNC(2);
        if constexpr (M == Mode::PI) SYNC(4);
        if constexpr (M == Mode::PD) SYNC(2);
        if constexpr (M == Mode::IX) SYNC(2);

        readOp<C, M, Byte>(dst, &ea, &data);

        reg.sr.n = NBIT<Byte>(data);
        reg.sr.z = ZERO<Byte>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
        data |= 0x80;

        // if (!isRegMode(M)) SYNC(2);
        writeOp<C, M, S>(dst, ea, data);

        prefetch<C, POLL>();
        SYNC(2);
    }

    FINALIZE
}